

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableSetBgColor(ImGuiTableBgTarget target,ImU32 color,int column_n)

{
  float *pfVar1;
  char cVar2;
  ImGuiTable *pIVar3;
  ImGuiTableCellData *pIVar4;
  ImU32 IVar5;
  ulong uVar6;
  
  uVar6 = (ulong)(uint)column_n;
  pIVar3 = GImGui->CurrentTable;
  IVar5 = 0;
  if (color != 0x1000000) {
    IVar5 = color;
  }
  if (target - 1U < 2) {
    pfVar1 = &(pIVar3->InnerClipRect).Max.y;
    if (pIVar3->RowPosY1 < *pfVar1 || pIVar3->RowPosY1 == *pfVar1) {
      pIVar3->RowBgColor[target == 2] = IVar5;
    }
  }
  else if ((target == 3) &&
          (pfVar1 = &(pIVar3->InnerClipRect).Max.y,
          pIVar3->RowPosY1 < *pfVar1 || pIVar3->RowPosY1 == *pfVar1)) {
    if (column_n == -1) {
      uVar6 = (ulong)(uint)pIVar3->CurrentColumn;
    }
    if ((pIVar3->VisibleMaskByIndex >> (uVar6 & 0x3f) & 1) != 0) {
      cVar2 = pIVar3->RowCellDataCurrent;
      if (((long)cVar2 < 0) || ((int)uVar6 != (int)(pIVar3->RowCellData).Data[cVar2].Column)) {
        pIVar3->RowCellDataCurrent = cVar2 + '\x01';
      }
      cVar2 = pIVar3->RowCellDataCurrent;
      pIVar4 = (pIVar3->RowCellData).Data;
      pIVar4[cVar2].BgColor = IVar5;
      pIVar4[cVar2].Column = (ImGuiTableColumnIdx)uVar6;
      return;
    }
  }
  return;
}

Assistant:

void ImGui::TableSetBgColor(ImGuiTableBgTarget target, ImU32 color, int column_n)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(target != ImGuiTableBgTarget_None);

    if (color == IM_COL32_DISABLE)
        color = 0;

    // We cannot draw neither the cell or row background immediately as we don't know the row height at this point in time.
    switch (target)
    {
    case ImGuiTableBgTarget_CellBg:
    {
        if (table->RowPosY1 > table->InnerClipRect.Max.y) // Discard
            return;
        if (column_n == -1)
            column_n = table->CurrentColumn;
        if ((table->VisibleMaskByIndex & ((ImU64)1 << column_n)) == 0)
            return;
        if (table->RowCellDataCurrent < 0 || table->RowCellData[table->RowCellDataCurrent].Column != column_n)
            table->RowCellDataCurrent++;
        ImGuiTableCellData* cell_data = &table->RowCellData[table->RowCellDataCurrent];
        cell_data->BgColor = color;
        cell_data->Column = (ImGuiTableColumnIdx)column_n;
        break;
    }
    case ImGuiTableBgTarget_RowBg0:
    case ImGuiTableBgTarget_RowBg1:
    {
        if (table->RowPosY1 > table->InnerClipRect.Max.y) // Discard
            return;
        IM_ASSERT(column_n == -1);
        int bg_idx = (target == ImGuiTableBgTarget_RowBg1) ? 1 : 0;
        table->RowBgColor[bg_idx] = color;
        break;
    }
    default:
        IM_ASSERT(0);
    }
}